

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O0

void __thiscall
vkt::ubo::anon_unknown_0::LinkByBindingCase::LinkByBindingCase
          (LinkByBindingCase *this,TestContext *testCtx,string *name,string *description,
          BufferMode bufferMode,int numInstances)

{
  UniformBlock *pUVar1;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  VarType local_420;
  allocator<char> local_401;
  string local_400;
  Uniform local_3e0;
  VarType local_3a0;
  allocator<char> local_381;
  string local_380;
  Uniform local_360;
  VarType local_320;
  allocator<char> local_301;
  string local_300;
  Uniform local_2e0;
  VarType local_2a0;
  allocator<char> local_281;
  string local_280;
  Uniform local_260;
  allocator<char> local_219;
  string local_218;
  UniformBlock *local_1f8;
  UniformBlock *blockB;
  allocator<char> local_1d1;
  string local_1d0;
  Uniform local_1b0;
  VarType local_170;
  allocator<char> local_151;
  string local_150;
  Uniform local_130;
  VarType local_f0;
  allocator<char> local_d1;
  string local_d0;
  Uniform local_b0;
  allocator<char> local_59;
  string local_58;
  UniformBlock *local_38;
  UniformBlock *blockA;
  int numInstances_local;
  BufferMode bufferMode_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  LinkByBindingCase *this_local;
  
  blockA._0_4_ = numInstances;
  blockA._4_4_ = bufferMode;
  _numInstances_local = description;
  description_local = name;
  name_local = (string *)testCtx;
  testCtx_local = (TestContext *)this;
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,LOAD_FULL_MATRIX,
             false);
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LinkByBindingCase_01668240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"TestBlock",&local_59);
  pUVar1 = ShaderInterface::allocBlock(&(this->super_UniformBlockCase).m_interface,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = pUVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"a",&local_d1);
  VarType::VarType(&local_f0,TYPE_FLOAT,4);
  Uniform::Uniform(&local_b0,&local_d0,&local_f0,0);
  UniformBlock::addUniform(pUVar1,&local_b0);
  Uniform::~Uniform(&local_b0);
  VarType::~VarType(&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pUVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"b",&local_151);
  VarType::VarType(&local_170,TYPE_UINT_VEC3,1);
  Uniform::Uniform(&local_130,&local_150,&local_170,0x1800);
  UniformBlock::addUniform(pUVar1,&local_130);
  Uniform::~Uniform(&local_130);
  VarType::~VarType(&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  pUVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"c",&local_1d1);
  VarType::VarType((VarType *)&blockB,TYPE_FLOAT_MAT2,2);
  Uniform::Uniform(&local_1b0,&local_1d0,(VarType *)&blockB,0);
  UniformBlock::addUniform(pUVar1,&local_1b0);
  Uniform::~Uniform(&local_1b0);
  VarType::~VarType((VarType *)&blockB);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  UniformBlock::setFlags(local_38,0x220);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"TestBlock",&local_219);
  pUVar1 = ShaderInterface::allocBlock(&(this->super_UniformBlockCase).m_interface,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  local_1f8 = pUVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"a",&local_281);
  VarType::VarType(&local_2a0,TYPE_FLOAT_MAT3,2);
  Uniform::Uniform(&local_260,&local_280,&local_2a0,0);
  UniformBlock::addUniform(pUVar1,&local_260);
  Uniform::~Uniform(&local_260);
  VarType::~VarType(&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  pUVar1 = local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"b",&local_301);
  VarType::VarType(&local_320,TYPE_INT_VEC2,1);
  Uniform::Uniform(&local_2e0,&local_300,&local_320,0);
  UniformBlock::addUniform(pUVar1,&local_2e0);
  Uniform::~Uniform(&local_2e0);
  VarType::~VarType(&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  pUVar1 = local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"c",&local_381);
  VarType::VarType(&local_3a0,TYPE_FLOAT_VEC4,4);
  Uniform::Uniform(&local_360,&local_380,&local_3a0,0x1800);
  UniformBlock::addUniform(pUVar1,&local_360);
  Uniform::~Uniform(&local_360);
  VarType::~VarType(&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  pUVar1 = local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"d",&local_401);
  VarType::VarType(&local_420,TYPE_BOOL,0);
  Uniform::Uniform(&local_3e0,&local_400,&local_420,0);
  UniformBlock::addUniform(pUVar1,&local_3e0);
  Uniform::~Uniform(&local_3e0);
  VarType::~VarType(&local_420);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  UniformBlock::setFlags(local_1f8,0x420);
  pUVar1 = local_38;
  if (0 < (int)blockA) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"testBlock",&local_441);
    UniformBlock::setInstanceName(pUVar1,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
    UniformBlock::setArraySize(local_38,(int)blockA);
    pUVar1 = local_1f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"testBlock",&local_469);
    UniformBlock::setInstanceName(pUVar1,&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    UniformBlock::setArraySize(local_1f8,(int)blockA);
  }
  (*(this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])()
  ;
  return;
}

Assistant:

LinkByBindingCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, BufferMode bufferMode, int numInstances)
		: UniformBlockCase	(testCtx, name, description, bufferMode, LOAD_FULL_MATRIX)
	{
		UniformBlock& blockA = m_interface.allocBlock("TestBlock");
		blockA.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT, PRECISION_HIGH)));
		blockA.addUniform(Uniform("b", VarType(glu::TYPE_UINT_VEC3, PRECISION_LOW), UNUSED_BOTH));
		blockA.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_MAT2, PRECISION_MEDIUM)));
		blockA.setFlags(LAYOUT_STD140|DECLARE_VERTEX);

		UniformBlock& blockB = m_interface.allocBlock("TestBlock");
		blockB.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM)));
		blockB.addUniform(Uniform("b", VarType(glu::TYPE_INT_VEC2, PRECISION_LOW)));
		blockB.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH));
		blockB.addUniform(Uniform("d", VarType(glu::TYPE_BOOL, 0)));
		blockB.setFlags(LAYOUT_STD140|DECLARE_FRAGMENT);

		if (numInstances > 0)
		{
			blockA.setInstanceName("testBlock");
			blockA.setArraySize(numInstances);
			blockB.setInstanceName("testBlock");
			blockB.setArraySize(numInstances);
		}

		init();
	}